

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int fm_write(chmgr *chmgr,uint8_t fn,void *payload,uint16_t len)

{
  uint16_t uVar1;
  uint8_t *payload_00;
  uint8_t *__ptr_1;
  uint16_t __v_1;
  uint8_t *__ptr;
  uint16_t __v;
  uint8_t *fm;
  uint16_t crc;
  uint16_t len_local;
  void *payload_local;
  uint8_t fn_local;
  chmgr *chmgr_local;
  
  payload_00 = (uint8_t *)malloc((long)(int)(len + 5));
  *payload_00 = fn;
  *(uint16_t *)(payload_00 + 1) = len;
  memcpy(payload_00 + 3,payload,(ulong)len);
  uVar1 = calc_crc(payload_00,len + 3);
  payload_00[(long)(int)(uint)len + 3] = (uint8_t)uVar1;
  (payload_00 + (long)(int)(uint)len + 3)[1] = (uint8_t)(uVar1 >> 8);
  slip_encode(chmgr->slip,payload_00,len + 5);
  return (int)len;
}

Assistant:

int fm_write(struct chmgr *chmgr, uint8_t fn, const void *payload, uint16_t len)
{
    uint16_t crc;
    uint8_t *fm = (uint8_t*)malloc(FM_HDR_SIZE + len + 2);

    fm[0] = fn;
    U16_TO_STREAM(fm + 1, len);
    memcpy(fm + 3, payload, len);
    crc = calc_crc(fm, FM_HDR_SIZE + len);
    U16_TO_STREAM(fm + FM_HDR_SIZE + len, crc);
    slip_encode(chmgr->slip, fm, FM_HDR_SIZE + len + 2);
    return len;
}